

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

vec4 dja::operator*(mat4 *m,vec4 *a)

{
  vec4 *pvVar1;
  float_t x;
  float_t y;
  float_t z;
  float_t w;
  vec4 *a_local;
  mat4 *m_local;
  
  pvVar1 = mat4::operator[](m,0);
  x = dot(pvVar1,a);
  pvVar1 = mat4::operator[](m,1);
  y = dot(pvVar1,a);
  pvVar1 = mat4::operator[](m,2);
  z = dot(pvVar1,a);
  pvVar1 = mat4::operator[](m,3);
  w = dot(pvVar1,a);
  vec4::vec4((vec4 *)&m_local,x,y,z,w);
  return _m_local;
}

Assistant:

vec4 operator*(const mat4& m, const vec4& a)
{
    return vec4(dot(m[0], a), dot(m[1], a), dot(m[2], a), dot(m[3], a));
}